

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx::BVHNIntersector1<8,_257,_true,_embree::avx::VirtualCurveIntersector1>::intersect
               (Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  uint uVar3;
  uint uVar4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  byte bVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [12];
  undefined1 auVar20 [28];
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  undefined1 (*pauVar24) [16];
  ulong uVar25;
  undefined1 (*pauVar26) [16];
  long lVar27;
  undefined1 (*pauVar28) [16];
  uint uVar29;
  ulong uVar30;
  ulong uVar31;
  undefined1 (*pauVar32) [16];
  ulong uVar33;
  undefined1 auVar34 [64];
  undefined1 auVar35 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar36 [16];
  float fVar43;
  float fVar44;
  float fVar45;
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  float fVar46;
  undefined1 auVar42 [32];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  undefined1 auVar49 [32];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  undefined1 auVar56 [32];
  float fVar61;
  vfloat4 a0;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  undefined1 auVar73 [64];
  float fVar79;
  float fVar83;
  float fVar84;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  undefined1 auVar82 [64];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [64];
  undefined1 auVar92 [16];
  undefined1 auVar93 [32];
  undefined1 auVar94 [64];
  float fVar95;
  undefined1 auVar96 [32];
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  undefined1 auVar97 [64];
  float fVar104;
  float fVar111;
  undefined1 auVar105 [16];
  undefined1 auVar106 [32];
  float fVar109;
  float fVar110;
  float fVar112;
  float fVar113;
  float fVar114;
  undefined1 auVar108 [64];
  float fVar115;
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  undefined1 auVar118 [64];
  undefined1 auVar125 [64];
  undefined1 auVar126 [16];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar130 [32];
  Precalculations pre;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_25c0 [32];
  undefined1 local_25a0 [8];
  float fStack_2598;
  float fStack_2590;
  float fStack_258c;
  float fStack_2588;
  undefined4 uStack_2584;
  undefined1 local_2580 [8];
  float fStack_2578;
  float fStack_2574;
  float fStack_2570;
  float fStack_256c;
  float fStack_2568;
  undefined1 local_2550 [16];
  undefined1 local_2540 [32];
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  undefined1 local_24e0 [32];
  undefined1 local_24c0 [32];
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  float local_2440;
  float fStack_243c;
  float fStack_2438;
  float fStack_2434;
  float fStack_2430;
  float fStack_242c;
  float fStack_2428;
  float fStack_2424;
  float local_2420;
  float fStack_241c;
  float fStack_2418;
  float fStack_2414;
  float fStack_2410;
  float fStack_240c;
  float fStack_2408;
  float fStack_2404;
  float local_2400;
  float fStack_23fc;
  float fStack_23f8;
  float fStack_23f4;
  float fStack_23f0;
  float fStack_23ec;
  float fStack_23e8;
  float fStack_23e4;
  float local_23e0 [4];
  undefined1 local_23d0 [16];
  undefined1 local_23c0 [16];
  undefined1 local_23b0 [16];
  long local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  undefined1 auVar72 [32];
  undefined1 auVar107 [32];
  undefined1 auVar129 [32];
  
  local_23a0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_23a0 != 8) {
    aVar2 = (ray->super_RayK<1>).dir.field_0.field_1;
    auVar36 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
    auVar35 = vrsqrtss_avx(auVar36,auVar36);
    fVar61 = auVar35._0_4_;
    local_23e0[0] = fVar61 * 1.5 - auVar36._0_4_ * 0.5 * fVar61 * fVar61 * fVar61;
    local_2400 = (ray->super_RayK<1>).dir.field_0.m128[0];
    fStack_23fc = local_2400;
    fStack_23f8 = local_2400;
    fStack_23f4 = local_2400;
    fStack_23f0 = local_2400;
    fStack_23ec = local_2400;
    fStack_23e8 = local_2400;
    fStack_23e4 = local_2400;
    local_2420 = (ray->super_RayK<1>).dir.field_0.m128[1];
    fStack_241c = local_2420;
    fStack_2418 = local_2420;
    fStack_2414 = local_2420;
    fStack_2410 = local_2420;
    fStack_240c = local_2420;
    fStack_2408 = local_2420;
    fStack_2404 = local_2420;
    local_2440 = (ray->super_RayK<1>).dir.field_0.m128[2];
    fStack_243c = local_2440;
    fStack_2438 = local_2440;
    fStack_2434 = local_2440;
    fStack_2430 = local_2440;
    fStack_242c = local_2440;
    fStack_2428 = local_2440;
    fStack_2424 = local_2440;
    auVar37 = vshufps_avx(ZEXT416((uint)local_23e0[0]),ZEXT416((uint)local_23e0[0]),0);
    auVar62._0_4_ = aVar2.x * auVar37._0_4_;
    auVar62._4_4_ = aVar2.y * auVar37._4_4_;
    auVar62._8_4_ = aVar2.z * auVar37._8_4_;
    auVar62._12_4_ = aVar2.field_3.w * auVar37._12_4_;
    auVar35 = vshufpd_avx(auVar62,auVar62,1);
    auVar36 = vmovshdup_avx(auVar62);
    auVar89._8_4_ = 0x80000000;
    auVar89._0_8_ = 0x8000000080000000;
    auVar89._12_4_ = 0x80000000;
    auVar66._12_4_ = 0;
    auVar66._0_12_ = ZEXT812(0);
    auVar66 = auVar66 << 0x20;
    auVar80 = vunpckhps_avx(auVar62,auVar66);
    auVar63 = vshufps_avx(auVar80,ZEXT416(auVar36._0_4_ ^ 0x80000000),0x41);
    auVar80._0_8_ = auVar35._0_8_ ^ 0x8000000080000000;
    auVar80._8_8_ = auVar89._8_8_ ^ auVar35._8_8_;
    auVar80 = vinsertps_avx(auVar80,auVar62,0x2a);
    auVar36 = vdpps_avx(auVar63,auVar63,0x7f);
    auVar35 = vdpps_avx(auVar80,auVar80,0x7f);
    auVar36 = vcmpps_avx(auVar35,auVar36,1);
    auVar36 = vshufps_avx(auVar36,auVar36,0);
    auVar36 = vblendvps_avx(auVar80,auVar63,auVar36);
    auVar35 = vdpps_avx(auVar36,auVar36,0x7f);
    auVar80 = vrsqrtss_avx(auVar35,auVar35);
    fVar61 = auVar80._0_4_;
    auVar35 = ZEXT416((uint)(fVar61 * 1.5 - auVar35._0_4_ * 0.5 * fVar61 * fVar61 * fVar61));
    auVar35 = vshufps_avx(auVar35,auVar35,0);
    auVar81._0_4_ = auVar35._0_4_ * auVar36._0_4_;
    auVar81._4_4_ = auVar35._4_4_ * auVar36._4_4_;
    auVar81._8_4_ = auVar35._8_4_ * auVar36._8_4_;
    auVar81._12_4_ = auVar35._12_4_ * auVar36._12_4_;
    auVar36 = vshufps_avx(auVar81,auVar81,0xc9);
    auVar35 = vshufps_avx(auVar62,auVar62,0xc9);
    auVar92._0_4_ = auVar35._0_4_ * auVar81._0_4_;
    auVar92._4_4_ = auVar35._4_4_ * auVar81._4_4_;
    auVar92._8_4_ = auVar35._8_4_ * auVar81._8_4_;
    auVar92._12_4_ = auVar35._12_4_ * auVar81._12_4_;
    auVar90._0_4_ = auVar36._0_4_ * auVar62._0_4_;
    auVar90._4_4_ = auVar36._4_4_ * auVar62._4_4_;
    auVar90._8_4_ = auVar36._8_4_ * auVar62._8_4_;
    auVar90._12_4_ = auVar36._12_4_ * auVar62._12_4_;
    auVar36 = vsubps_avx(auVar90,auVar92);
    auVar80 = vshufps_avx(auVar36,auVar36,0xc9);
    auVar36 = vdpps_avx(auVar80,auVar80,0x7f);
    auVar35 = vrsqrtss_avx(auVar36,auVar36);
    fVar61 = auVar35._0_4_;
    auVar36 = ZEXT416((uint)(fVar61 * 1.5 - auVar36._0_4_ * 0.5 * fVar61 * fVar61 * fVar61));
    auVar36 = vshufps_avx(auVar36,auVar36,0);
    auVar35._0_4_ = auVar80._0_4_ * auVar36._0_4_;
    auVar35._4_4_ = auVar80._4_4_ * auVar36._4_4_;
    auVar35._8_4_ = auVar80._8_4_ * auVar36._8_4_;
    auVar35._12_4_ = auVar80._12_4_ * auVar36._12_4_;
    auVar36._0_4_ = auVar37._0_4_ * auVar62._0_4_;
    auVar36._4_4_ = auVar37._4_4_ * auVar62._4_4_;
    auVar36._8_4_ = auVar37._8_4_ * auVar62._8_4_;
    auVar36._12_4_ = auVar37._12_4_ * auVar62._12_4_;
    auVar80 = vunpcklps_avx(auVar81,auVar36);
    auVar36 = vunpckhps_avx(auVar81,auVar36);
    auVar37 = vunpcklps_avx(auVar35,auVar66);
    auVar35 = vunpckhps_avx(auVar35,auVar66);
    local_23b0 = vunpcklps_avx(auVar36,auVar35);
    local_23d0 = vunpcklps_avx(auVar80,auVar37);
    local_23c0 = vunpckhps_avx(auVar80,auVar37);
    pauVar32 = (undefined1 (*) [16])local_2390;
    auVar80 = vmaxss_avx(ZEXT816(0) << 0x20,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    uStack_2398 = 0;
    auVar37 = vmaxss_avx(ZEXT816(0) << 0x20,ZEXT416((uint)(ray->super_RayK<1>).tfar));
    auVar63._8_4_ = 0x7fffffff;
    auVar63._0_8_ = 0x7fffffff7fffffff;
    auVar63._12_4_ = 0x7fffffff;
    auVar36 = vandps_avx((undefined1  [16])aVar2,auVar63);
    auVar67._8_4_ = 0x219392ef;
    auVar67._0_8_ = 0x219392ef219392ef;
    auVar67._12_4_ = 0x219392ef;
    auVar36 = vcmpps_avx(auVar36,auVar67,1);
    auVar68._8_4_ = 0x3f800000;
    auVar68._0_8_ = 0x3f8000003f800000;
    auVar68._12_4_ = 0x3f800000;
    auVar35 = vdivps_avx(auVar68,(undefined1  [16])aVar2);
    auVar69._8_4_ = 0x5d5e0b6b;
    auVar69._0_8_ = 0x5d5e0b6b5d5e0b6b;
    auVar69._12_4_ = 0x5d5e0b6b;
    auVar36 = vblendvps_avx(auVar35,auVar69,auVar36);
    auVar64._0_4_ = auVar36._0_4_ * 0.99999964;
    auVar64._4_4_ = auVar36._4_4_ * 0.99999964;
    auVar64._8_4_ = auVar36._8_4_ * 0.99999964;
    auVar64._12_4_ = auVar36._12_4_ * 0.99999964;
    uVar1 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
    local_2460._4_4_ = uVar1;
    local_2460._0_4_ = uVar1;
    local_2460._8_4_ = uVar1;
    local_2460._12_4_ = uVar1;
    local_2460._16_4_ = uVar1;
    local_2460._20_4_ = uVar1;
    local_2460._24_4_ = uVar1;
    local_2460._28_4_ = uVar1;
    auVar82 = ZEXT3264(local_2460);
    uVar1 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
    local_2480._4_4_ = uVar1;
    local_2480._0_4_ = uVar1;
    local_2480._8_4_ = uVar1;
    local_2480._12_4_ = uVar1;
    local_2480._16_4_ = uVar1;
    local_2480._20_4_ = uVar1;
    local_2480._24_4_ = uVar1;
    local_2480._28_4_ = uVar1;
    auVar91 = ZEXT3264(local_2480);
    fVar61 = (ray->super_RayK<1>).org.field_0.m128[2];
    auVar130._4_4_ = fVar61;
    auVar130._0_4_ = fVar61;
    auVar130._8_4_ = fVar61;
    auVar130._12_4_ = fVar61;
    auVar130._16_4_ = fVar61;
    auVar130._20_4_ = fVar61;
    auVar130._24_4_ = fVar61;
    auVar130._28_4_ = fVar61;
    auVar70._0_4_ = auVar36._0_4_ * 1.0000004;
    auVar70._4_4_ = auVar36._4_4_ * 1.0000004;
    auVar70._8_4_ = auVar36._8_4_ * 1.0000004;
    auVar70._12_4_ = auVar36._12_4_ * 1.0000004;
    auVar36 = vshufps_avx(auVar64,auVar64,0);
    local_24a0._16_16_ = auVar36;
    local_24a0._0_16_ = auVar36;
    auVar94 = ZEXT3264(local_24a0);
    auVar36 = vmovshdup_avx(auVar64);
    auVar35 = vshufps_avx(auVar64,auVar64,0x55);
    local_24c0._16_16_ = auVar35;
    local_24c0._0_16_ = auVar35;
    auVar97 = ZEXT3264(local_24c0);
    auVar35 = vshufpd_avx(auVar64,auVar64,1);
    auVar63 = vshufps_avx(auVar64,auVar64,0xaa);
    local_24e0._16_16_ = auVar63;
    local_24e0._0_16_ = auVar63;
    auVar108 = ZEXT3264(local_24e0);
    auVar63 = vshufps_avx(auVar70,auVar70,0);
    local_2500._16_16_ = auVar63;
    local_2500._0_16_ = auVar63;
    auVar118 = ZEXT3264(local_2500);
    uVar31 = (ulong)(auVar64._0_4_ < 0.0) * 0x20;
    auVar63 = vshufps_avx(auVar70,auVar70,0x55);
    local_2520._16_16_ = auVar63;
    local_2520._0_16_ = auVar63;
    auVar73 = ZEXT3264(local_2520);
    auVar63 = vshufps_avx(auVar70,auVar70,0xaa);
    local_2540._16_16_ = auVar63;
    local_2540._0_16_ = auVar63;
    auVar125 = ZEXT3264(local_2540);
    uVar30 = (ulong)(auVar36._0_4_ < 0.0) << 5 | 0x40;
    uVar33 = (ulong)(auVar35._0_4_ < 0.0) << 5 | 0x80;
    auVar36 = vshufps_avx(auVar80,auVar80,0);
    auVar127._16_16_ = auVar36;
    auVar127._0_16_ = auVar36;
    auVar36 = vshufps_avx(auVar37,auVar37,0);
    auVar34 = ZEXT3264(CONCAT1616(auVar36,auVar36));
    do {
      pauVar24 = pauVar32 + -1;
      pauVar32 = pauVar32 + -1;
      if (*(float *)(*pauVar24 + 8) <= (ray->super_RayK<1>).tfar) {
        uVar21 = *(ulong *)*pauVar32;
LAB_014c5b69:
        if ((uVar21 & 0xf) == 0) {
          auVar93 = vsubps_avx(*(undefined1 (*) [32])(uVar21 + 0x40 + uVar31),auVar82._0_32_);
          auVar9._4_4_ = auVar94._4_4_ * auVar93._4_4_;
          auVar9._0_4_ = auVar94._0_4_ * auVar93._0_4_;
          auVar9._8_4_ = auVar94._8_4_ * auVar93._8_4_;
          auVar9._12_4_ = auVar94._12_4_ * auVar93._12_4_;
          auVar9._16_4_ = auVar94._16_4_ * auVar93._16_4_;
          auVar9._20_4_ = auVar94._20_4_ * auVar93._20_4_;
          auVar9._24_4_ = auVar94._24_4_ * auVar93._24_4_;
          auVar9._28_4_ = auVar93._28_4_;
          auVar93 = vsubps_avx(*(undefined1 (*) [32])(uVar21 + 0x40 + uVar30),auVar91._0_32_);
          auVar10._4_4_ = auVar97._4_4_ * auVar93._4_4_;
          auVar10._0_4_ = auVar97._0_4_ * auVar93._0_4_;
          auVar10._8_4_ = auVar97._8_4_ * auVar93._8_4_;
          auVar10._12_4_ = auVar97._12_4_ * auVar93._12_4_;
          auVar10._16_4_ = auVar97._16_4_ * auVar93._16_4_;
          auVar10._20_4_ = auVar97._20_4_ * auVar93._20_4_;
          auVar10._24_4_ = auVar97._24_4_ * auVar93._24_4_;
          auVar10._28_4_ = auVar93._28_4_;
          auVar93 = vmaxps_avx(auVar9,auVar10);
          auVar5 = vsubps_avx(*(undefined1 (*) [32])(uVar21 + 0x40 + uVar33),auVar130);
          auVar11._4_4_ = auVar108._4_4_ * auVar5._4_4_;
          auVar11._0_4_ = auVar108._0_4_ * auVar5._0_4_;
          auVar11._8_4_ = auVar108._8_4_ * auVar5._8_4_;
          auVar11._12_4_ = auVar108._12_4_ * auVar5._12_4_;
          auVar11._16_4_ = auVar108._16_4_ * auVar5._16_4_;
          auVar11._20_4_ = auVar108._20_4_ * auVar5._20_4_;
          auVar11._24_4_ = auVar108._24_4_ * auVar5._24_4_;
          auVar11._28_4_ = auVar5._28_4_;
          auVar5 = vsubps_avx(*(undefined1 (*) [32])(uVar21 + 0x40 + (uVar31 ^ 0x20)),auVar82._0_32_
                             );
          auVar12._4_4_ = auVar118._4_4_ * auVar5._4_4_;
          auVar12._0_4_ = auVar118._0_4_ * auVar5._0_4_;
          auVar12._8_4_ = auVar118._8_4_ * auVar5._8_4_;
          auVar12._12_4_ = auVar118._12_4_ * auVar5._12_4_;
          auVar12._16_4_ = auVar118._16_4_ * auVar5._16_4_;
          auVar12._20_4_ = auVar118._20_4_ * auVar5._20_4_;
          auVar12._24_4_ = auVar118._24_4_ * auVar5._24_4_;
          auVar12._28_4_ = auVar5._28_4_;
          auVar5 = vsubps_avx(*(undefined1 (*) [32])(uVar21 + 0x40 + (uVar30 ^ 0x20)),auVar91._0_32_
                             );
          auVar13._4_4_ = auVar73._4_4_ * auVar5._4_4_;
          auVar13._0_4_ = auVar73._0_4_ * auVar5._0_4_;
          auVar13._8_4_ = auVar73._8_4_ * auVar5._8_4_;
          auVar13._12_4_ = auVar73._12_4_ * auVar5._12_4_;
          auVar13._16_4_ = auVar73._16_4_ * auVar5._16_4_;
          auVar13._20_4_ = auVar73._20_4_ * auVar5._20_4_;
          auVar13._24_4_ = auVar73._24_4_ * auVar5._24_4_;
          auVar13._28_4_ = auVar5._28_4_;
          auVar42 = vminps_avx(auVar12,auVar13);
          auVar5 = vsubps_avx(*(undefined1 (*) [32])(uVar21 + 0x40 + (uVar33 ^ 0x20)),auVar130);
          auVar14._4_4_ = auVar125._4_4_ * auVar5._4_4_;
          auVar14._0_4_ = auVar125._0_4_ * auVar5._0_4_;
          auVar14._8_4_ = auVar125._8_4_ * auVar5._8_4_;
          auVar14._12_4_ = auVar125._12_4_ * auVar5._12_4_;
          auVar14._16_4_ = auVar125._16_4_ * auVar5._16_4_;
          auVar14._20_4_ = auVar125._20_4_ * auVar5._20_4_;
          auVar14._24_4_ = auVar125._24_4_ * auVar5._24_4_;
          auVar14._28_4_ = auVar5._28_4_;
          auVar5 = vmaxps_avx(auVar11,auVar127);
          local_25c0 = vmaxps_avx(auVar93,auVar5);
          auVar93 = vminps_avx(auVar14,auVar34._0_32_);
          auVar93 = vminps_avx(auVar42,auVar93);
          auVar93 = vcmpps_avx(local_25c0,auVar93,2);
          auVar36 = vpackssdw_avx(auVar93._0_16_,auVar93._16_16_);
        }
        else {
          if ((int)(uVar21 & 0xf) != 2) {
            (**(code **)((long)This->leafIntersector +
                        (ulong)*(byte *)(uVar21 & 0xfffffffffffffff0) * 0x40))
                      (local_23e0,ray,context);
            fVar43 = (ray->super_RayK<1>).tfar;
            auVar34 = ZEXT3264(CONCAT428(fVar43,CONCAT424(fVar43,CONCAT420(fVar43,CONCAT416(fVar43,
                                                  CONCAT412(fVar43,CONCAT48(fVar43,CONCAT44(fVar43,
                                                  fVar43))))))));
            auVar82 = ZEXT3264(local_2460);
            auVar91 = ZEXT3264(local_2480);
            auVar94 = ZEXT3264(local_24a0);
            auVar97 = ZEXT3264(local_24c0);
            auVar108 = ZEXT3264(local_24e0);
            auVar118 = ZEXT3264(local_2500);
            auVar73 = ZEXT3264(local_2520);
            auVar125 = ZEXT3264(local_2540);
            goto LAB_014c62ec;
          }
          uVar23 = uVar21 & 0xfffffffffffffff0;
          auVar19 = *(undefined1 (*) [12])(uVar23 + 0x60);
          fStack_2590 = *(float *)(uVar23 + 0x70);
          fStack_258c = *(float *)(uVar23 + 0x74);
          fStack_2588 = *(float *)(uVar23 + 0x78);
          uStack_2584 = *(undefined4 *)(uVar23 + 0x7c);
          auVar20 = *(undefined1 (*) [28])(uVar23 + 0x80);
          fVar43 = *(float *)(uVar23 + 0xbc);
          auVar106._0_4_ =
               local_2440 * *(float *)(uVar23 + 0x100) + local_2420 * *(float *)(uVar23 + 0xa0) +
               local_2400 * *(float *)(uVar23 + 0x40);
          auVar106._4_4_ =
               fStack_243c * *(float *)(uVar23 + 0x104) + fStack_241c * *(float *)(uVar23 + 0xa4) +
               fStack_23fc * *(float *)(uVar23 + 0x44);
          auVar106._8_4_ =
               fStack_2438 * *(float *)(uVar23 + 0x108) + fStack_2418 * *(float *)(uVar23 + 0xa8) +
               fStack_23f8 * *(float *)(uVar23 + 0x48);
          auVar106._12_4_ =
               fStack_2434 * *(float *)(uVar23 + 0x10c) + fStack_2414 * *(float *)(uVar23 + 0xac) +
               fStack_23f4 * *(float *)(uVar23 + 0x4c);
          auVar106._16_4_ =
               fStack_2430 * *(float *)(uVar23 + 0x110) + fStack_2410 * *(float *)(uVar23 + 0xb0) +
               fStack_23f0 * *(float *)(uVar23 + 0x50);
          auVar106._20_4_ =
               fStack_242c * *(float *)(uVar23 + 0x114) + fStack_240c * *(float *)(uVar23 + 0xb4) +
               fStack_23ec * *(float *)(uVar23 + 0x54);
          auVar106._24_4_ =
               fStack_2428 * *(float *)(uVar23 + 0x118) + fStack_2408 * *(float *)(uVar23 + 0xb8) +
               fStack_23e8 * *(float *)(uVar23 + 0x58);
          auVar106._28_4_ = auVar91._28_4_ + auVar108._28_4_ + fStack_2404;
          auVar116._0_4_ =
               local_2440 * *(float *)(uVar23 + 0x120) + local_2420 * *(float *)(uVar23 + 0xc0) +
               local_2400 * *(float *)*(undefined1 (*) [12])(uVar23 + 0x60);
          auVar116._4_4_ =
               fStack_243c * *(float *)(uVar23 + 0x124) + fStack_241c * *(float *)(uVar23 + 0xc4) +
               fStack_23fc * *(float *)(uVar23 + 100);
          auVar116._8_4_ =
               fStack_2438 * *(float *)(uVar23 + 0x128) + fStack_2418 * *(float *)(uVar23 + 200) +
               fStack_23f8 * *(float *)(uVar23 + 0x68);
          auVar116._12_4_ =
               fStack_2434 * *(float *)(uVar23 + 300) + fStack_2414 * *(float *)(uVar23 + 0xcc) +
               fStack_23f4 * *(float *)(uVar23 + 0x6c);
          auVar116._16_4_ =
               fStack_2430 * *(float *)(uVar23 + 0x130) + fStack_2410 * *(float *)(uVar23 + 0xd0) +
               fStack_23f0 * fStack_2590;
          auVar116._20_4_ =
               fStack_242c * *(float *)(uVar23 + 0x134) + fStack_240c * *(float *)(uVar23 + 0xd4) +
               fStack_23ec * fStack_258c;
          auVar116._24_4_ =
               fStack_2428 * *(float *)(uVar23 + 0x138) + fStack_2408 * *(float *)(uVar23 + 0xd8) +
               fStack_23e8 * fStack_2588;
          auVar116._28_4_ = auVar94._28_4_ + auVar118._28_4_ + fStack_2404;
          auVar96._0_4_ =
               local_2440 * *(float *)(uVar23 + 0x140) + local_2420 * *(float *)(uVar23 + 0xe0) +
               local_2400 * *(float *)*(undefined1 (*) [28])(uVar23 + 0x80);
          auVar96._4_4_ =
               fStack_243c * *(float *)(uVar23 + 0x144) + fStack_241c * *(float *)(uVar23 + 0xe4) +
               fStack_23fc * *(float *)(uVar23 + 0x84);
          auVar96._8_4_ =
               fStack_2438 * *(float *)(uVar23 + 0x148) + fStack_2418 * *(float *)(uVar23 + 0xe8) +
               fStack_23f8 * *(float *)(uVar23 + 0x88);
          auVar96._12_4_ =
               fStack_2434 * *(float *)(uVar23 + 0x14c) + fStack_2414 * *(float *)(uVar23 + 0xec) +
               fStack_23f4 * *(float *)(uVar23 + 0x8c);
          auVar96._16_4_ =
               fStack_2430 * *(float *)(uVar23 + 0x150) + fStack_2410 * *(float *)(uVar23 + 0xf0) +
               fStack_23f0 * *(float *)(uVar23 + 0x90);
          auVar96._20_4_ =
               fStack_242c * *(float *)(uVar23 + 0x154) + fStack_240c * *(float *)(uVar23 + 0xf4) +
               fStack_23ec * *(float *)(uVar23 + 0x94);
          auVar96._24_4_ =
               fStack_2428 * *(float *)(uVar23 + 0x158) + fStack_2408 * *(float *)(uVar23 + 0xf8) +
               fStack_23e8 * *(float *)(uVar23 + 0x98);
          auVar96._28_4_ = auVar97._28_4_ + fStack_2404 + fStack_2404;
          auVar40._8_4_ = 0x7fffffff;
          auVar40._0_8_ = 0x7fffffff7fffffff;
          auVar40._12_4_ = 0x7fffffff;
          auVar40._16_4_ = 0x7fffffff;
          auVar40._20_4_ = 0x7fffffff;
          auVar40._24_4_ = 0x7fffffff;
          auVar40._28_4_ = 0x7fffffff;
          auVar93 = vandps_avx(auVar106,auVar40);
          auVar128._8_4_ = 0x219392ef;
          auVar128._0_8_ = 0x219392ef219392ef;
          auVar128._12_4_ = 0x219392ef;
          auVar128._16_4_ = 0x219392ef;
          auVar128._20_4_ = 0x219392ef;
          auVar128._24_4_ = 0x219392ef;
          auVar128._28_4_ = 0x219392ef;
          auVar93 = vcmpps_avx(auVar93,auVar128,1);
          auVar5 = vblendvps_avx(auVar106,auVar128,auVar93);
          auVar93 = vandps_avx(auVar116,auVar40);
          auVar93 = vcmpps_avx(auVar93,auVar128,1);
          auVar42 = vblendvps_avx(auVar116,auVar128,auVar93);
          auVar93 = vandps_avx(auVar96,auVar40);
          auVar93 = vcmpps_avx(auVar93,auVar128,1);
          auVar93 = vblendvps_avx(auVar96,auVar128,auVar93);
          auVar40 = vrcpps_avx(auVar5);
          fVar95 = auVar40._0_4_;
          fVar98 = auVar40._4_4_;
          auVar6._4_4_ = fVar98 * auVar5._4_4_;
          auVar6._0_4_ = fVar95 * auVar5._0_4_;
          fVar99 = auVar40._8_4_;
          auVar6._8_4_ = fVar99 * auVar5._8_4_;
          fVar100 = auVar40._12_4_;
          auVar6._12_4_ = fVar100 * auVar5._12_4_;
          fVar101 = auVar40._16_4_;
          auVar6._16_4_ = fVar101 * auVar5._16_4_;
          fVar102 = auVar40._20_4_;
          auVar6._20_4_ = fVar102 * auVar5._20_4_;
          fVar103 = auVar40._24_4_;
          auVar6._24_4_ = fVar103 * auVar5._24_4_;
          auVar6._28_4_ = auVar5._28_4_;
          auVar41._8_4_ = 0x3f800000;
          auVar41._0_8_ = 0x3f8000003f800000;
          auVar41._12_4_ = 0x3f800000;
          auVar41._16_4_ = 0x3f800000;
          auVar41._20_4_ = 0x3f800000;
          auVar41._24_4_ = 0x3f800000;
          auVar41._28_4_ = 0x3f800000;
          auVar6 = vsubps_avx(auVar41,auVar6);
          fVar95 = fVar95 + fVar95 * auVar6._0_4_;
          fVar98 = fVar98 + fVar98 * auVar6._4_4_;
          fVar99 = fVar99 + fVar99 * auVar6._8_4_;
          fVar100 = fVar100 + fVar100 * auVar6._12_4_;
          fVar101 = fVar101 + fVar101 * auVar6._16_4_;
          fVar102 = fVar102 + fVar102 * auVar6._20_4_;
          fVar103 = fVar103 + fVar103 * auVar6._24_4_;
          auVar5 = vrcpps_avx(auVar42);
          fVar104 = auVar5._0_4_;
          fVar109 = auVar5._4_4_;
          auVar7._4_4_ = fVar109 * auVar42._4_4_;
          auVar7._0_4_ = fVar104 * auVar42._0_4_;
          fVar110 = auVar5._8_4_;
          auVar7._8_4_ = fVar110 * auVar42._8_4_;
          fVar111 = auVar5._12_4_;
          auVar7._12_4_ = fVar111 * auVar42._12_4_;
          fVar112 = auVar5._16_4_;
          auVar7._16_4_ = fVar112 * auVar42._16_4_;
          fVar113 = auVar5._20_4_;
          auVar7._20_4_ = fVar113 * auVar42._20_4_;
          fVar114 = auVar5._24_4_;
          auVar7._24_4_ = fVar114 * auVar42._24_4_;
          auVar7._28_4_ = auVar42._28_4_;
          auVar7 = vsubps_avx(auVar41,auVar7);
          fVar104 = fVar104 + fVar104 * auVar7._0_4_;
          fVar109 = fVar109 + fVar109 * auVar7._4_4_;
          fVar110 = fVar110 + fVar110 * auVar7._8_4_;
          fVar111 = fVar111 + fVar111 * auVar7._12_4_;
          fVar112 = fVar112 + fVar112 * auVar7._16_4_;
          fVar113 = fVar113 + fVar113 * auVar7._20_4_;
          fVar114 = fVar114 + fVar114 * auVar7._24_4_;
          auVar42 = vrcpps_avx(auVar93);
          fVar115 = auVar42._0_4_;
          fVar119 = auVar42._4_4_;
          auVar15._4_4_ = fVar119 * auVar93._4_4_;
          auVar15._0_4_ = fVar115 * auVar93._0_4_;
          fVar120 = auVar42._8_4_;
          auVar15._8_4_ = fVar120 * auVar93._8_4_;
          fVar121 = auVar42._12_4_;
          auVar15._12_4_ = fVar121 * auVar93._12_4_;
          fVar122 = auVar42._16_4_;
          auVar15._16_4_ = fVar122 * auVar93._16_4_;
          fVar123 = auVar42._20_4_;
          auVar15._20_4_ = fVar123 * auVar93._20_4_;
          fVar124 = auVar42._24_4_;
          auVar15._24_4_ = fVar124 * auVar93._24_4_;
          auVar15._28_4_ = auVar93._28_4_;
          auVar93 = vsubps_avx(auVar41,auVar15);
          fVar115 = fVar115 + fVar115 * auVar93._0_4_;
          fVar119 = fVar119 + fVar119 * auVar93._4_4_;
          fVar120 = fVar120 + fVar120 * auVar93._8_4_;
          fVar121 = fVar121 + fVar121 * auVar93._12_4_;
          fVar122 = fVar122 + fVar122 * auVar93._16_4_;
          fVar123 = fVar123 + fVar123 * auVar93._20_4_;
          fVar124 = fVar124 + fVar124 * auVar93._24_4_;
          fVar44 = local_2480._0_4_;
          fVar45 = local_2480._4_4_;
          fVar74 = local_2480._8_4_;
          fVar75 = local_2480._12_4_;
          fVar76 = local_2480._16_4_;
          fVar77 = local_2480._20_4_;
          fVar78 = local_2480._24_4_;
          fVar53 = fVar43 + *(float *)(uVar23 + 0x11c) + *(float *)(uVar23 + 0x17c);
          fVar46 = fVar43 + *(float *)(uVar23 + 0x13c) + *(float *)(uVar23 + 0x19c);
          auVar82 = ZEXT3264(local_2460);
          fVar79 = local_2460._0_4_;
          fVar83 = local_2460._4_4_;
          fVar84 = local_2460._8_4_;
          fVar85 = local_2460._12_4_;
          fVar86 = local_2460._16_4_;
          fVar87 = local_2460._20_4_;
          fVar88 = local_2460._24_4_;
          fVar60 = *(float *)(uVar23 + 0x5c) + fVar53;
          auVar54._0_4_ =
               -fVar95 * (fVar79 * *(float *)(uVar23 + 0x40) +
                         fVar44 * *(float *)(uVar23 + 0xa0) +
                         fVar61 * *(float *)(uVar23 + 0x100) + *(float *)(uVar23 + 0x160));
          auVar54._4_4_ =
               -fVar98 * (fVar83 * *(float *)(uVar23 + 0x44) +
                         fVar45 * *(float *)(uVar23 + 0xa4) +
                         fVar61 * *(float *)(uVar23 + 0x104) + *(float *)(uVar23 + 0x164));
          auVar54._8_4_ =
               -fVar99 * (fVar84 * *(float *)(uVar23 + 0x48) +
                         fVar74 * *(float *)(uVar23 + 0xa8) +
                         fVar61 * *(float *)(uVar23 + 0x108) + *(float *)(uVar23 + 0x168));
          auVar54._12_4_ =
               -fVar100 *
               (fVar85 * *(float *)(uVar23 + 0x4c) +
               fVar75 * *(float *)(uVar23 + 0xac) +
               fVar61 * *(float *)(uVar23 + 0x10c) + *(float *)(uVar23 + 0x16c));
          fVar57 = -fVar101 *
                   (fVar86 * *(float *)(uVar23 + 0x50) +
                   fVar76 * *(float *)(uVar23 + 0xb0) +
                   fVar61 * *(float *)(uVar23 + 0x110) + *(float *)(uVar23 + 0x170));
          auVar16._16_4_ = fVar57;
          auVar16._0_16_ = auVar54;
          fVar58 = -fVar102 *
                   (fVar87 * *(float *)(uVar23 + 0x54) +
                   fVar77 * *(float *)(uVar23 + 0xb4) +
                   fVar61 * *(float *)(uVar23 + 0x114) + *(float *)(uVar23 + 0x174));
          auVar16._20_4_ = fVar58;
          fVar59 = -fVar103 *
                   (fVar88 * *(float *)(uVar23 + 0x58) +
                   fVar78 * *(float *)(uVar23 + 0xb8) +
                   fVar61 * *(float *)(uVar23 + 0x118) + *(float *)(uVar23 + 0x178));
          auVar16._24_4_ = fVar59;
          auVar16._28_4_ = fVar60;
          local_25a0._0_4_ = auVar19._0_4_;
          local_25a0._4_4_ = auVar19._4_4_;
          fStack_2598 = auVar19._8_4_;
          fVar53 = fVar53 + fVar46;
          auVar47._0_4_ =
               -fVar104 *
               (fVar79 * (float)local_25a0._0_4_ +
               *(float *)(uVar23 + 0xc0) * fVar44 +
               *(float *)(uVar23 + 0x120) * fVar61 + *(float *)(uVar23 + 0x180));
          auVar47._4_4_ =
               -fVar109 *
               (fVar83 * (float)local_25a0._4_4_ +
               *(float *)(uVar23 + 0xc4) * fVar45 +
               *(float *)(uVar23 + 0x124) * fVar61 + *(float *)(uVar23 + 0x184));
          auVar47._8_4_ =
               -fVar110 *
               (fVar84 * fStack_2598 +
               *(float *)(uVar23 + 200) * fVar74 +
               *(float *)(uVar23 + 0x128) * fVar61 + *(float *)(uVar23 + 0x188));
          auVar47._12_4_ =
               -fVar111 *
               (fVar85 * *(float *)(uVar23 + 0x6c) +
               *(float *)(uVar23 + 0xcc) * fVar75 +
               *(float *)(uVar23 + 300) * fVar61 + *(float *)(uVar23 + 0x18c));
          fVar50 = -fVar112 *
                   (fVar86 * fStack_2590 +
                   *(float *)(uVar23 + 0xd0) * fVar76 +
                   *(float *)(uVar23 + 0x130) * fVar61 + *(float *)(uVar23 + 400));
          auVar17._16_4_ = fVar50;
          auVar17._0_16_ = auVar47;
          fVar51 = -fVar113 *
                   (fVar87 * fStack_258c +
                   *(float *)(uVar23 + 0xd4) * fVar77 +
                   *(float *)(uVar23 + 0x134) * fVar61 + *(float *)(uVar23 + 0x194));
          auVar17._20_4_ = fVar51;
          fVar52 = -fVar114 *
                   (fVar88 * fStack_2588 +
                   *(float *)(uVar23 + 0xd8) * fVar78 +
                   *(float *)(uVar23 + 0x138) * fVar61 + *(float *)(uVar23 + 0x198));
          auVar17._24_4_ = fVar52;
          auVar17._28_4_ = fVar53;
          local_2580._0_4_ = auVar20._0_4_;
          local_2580._4_4_ = auVar20._4_4_;
          fStack_2578 = auVar20._8_4_;
          fStack_2574 = auVar20._12_4_;
          fStack_2570 = auVar20._16_4_;
          fStack_256c = auVar20._20_4_;
          fStack_2568 = auVar20._24_4_;
          fVar46 = fVar46 + fVar43 + *(float *)(uVar23 + 0x15c) + *(float *)(uVar23 + 0x1bc);
          auVar37._0_4_ =
               -fVar115 *
               (fVar79 * (float)local_2580._0_4_ +
               *(float *)(uVar23 + 0xe0) * fVar44 +
               *(float *)(uVar23 + 0x140) * fVar61 + *(float *)(uVar23 + 0x1a0));
          auVar37._4_4_ =
               -fVar119 *
               (fVar83 * (float)local_2580._4_4_ +
               *(float *)(uVar23 + 0xe4) * fVar45 +
               *(float *)(uVar23 + 0x144) * fVar61 + *(float *)(uVar23 + 0x1a4));
          auVar37._8_4_ =
               -fVar120 *
               (fVar84 * fStack_2578 +
               *(float *)(uVar23 + 0xe8) * fVar74 +
               *(float *)(uVar23 + 0x148) * fVar61 + *(float *)(uVar23 + 0x1a8));
          auVar37._12_4_ =
               -fVar121 *
               (fVar85 * fStack_2574 +
               *(float *)(uVar23 + 0xec) * fVar75 +
               *(float *)(uVar23 + 0x14c) * fVar61 + *(float *)(uVar23 + 0x1ac));
          fVar43 = -fVar122 *
                   (fVar86 * fStack_2570 +
                   *(float *)(uVar23 + 0xf0) * fVar76 +
                   *(float *)(uVar23 + 0x150) * fVar61 + *(float *)(uVar23 + 0x1b0));
          auVar18._16_4_ = fVar43;
          auVar18._0_16_ = auVar37;
          fVar44 = -fVar123 *
                   (fVar87 * fStack_256c +
                   *(float *)(uVar23 + 0xf4) * fVar77 +
                   *(float *)(uVar23 + 0x154) * fVar61 + *(float *)(uVar23 + 0x1b4));
          auVar18._20_4_ = fVar44;
          fVar45 = -fVar124 *
                   (fVar88 * fStack_2568 +
                   *(float *)(uVar23 + 0xf8) * fVar78 +
                   *(float *)(uVar23 + 0x158) * fVar61 + *(float *)(uVar23 + 0x1b8));
          auVar18._24_4_ = fVar45;
          auVar18._28_4_ = fVar46;
          auVar71._0_4_ = fVar95 + auVar54._0_4_;
          auVar71._4_4_ = fVar98 + auVar54._4_4_;
          auVar71._8_4_ = fVar99 + auVar54._8_4_;
          auVar71._12_4_ = fVar100 + auVar54._12_4_;
          auVar72._16_4_ = fVar101 + fVar57;
          auVar72._0_16_ = auVar71;
          auVar72._20_4_ = fVar102 + fVar58;
          auVar72._24_4_ = fVar103 + fVar59;
          auVar72._28_4_ = auVar40._28_4_ + auVar6._28_4_ + fVar60;
          auVar105._0_4_ = fVar104 + auVar47._0_4_;
          auVar105._4_4_ = fVar109 + auVar47._4_4_;
          auVar105._8_4_ = fVar110 + auVar47._8_4_;
          auVar105._12_4_ = fVar111 + auVar47._12_4_;
          auVar107._16_4_ = fVar112 + fVar50;
          auVar107._0_16_ = auVar105;
          auVar107._20_4_ = fVar113 + fVar51;
          auVar107._24_4_ = fVar114 + fVar52;
          auVar107._28_4_ = auVar5._28_4_ + auVar7._28_4_ + fVar53;
          auVar126._0_4_ = fVar115 + auVar37._0_4_;
          auVar126._4_4_ = fVar119 + auVar37._4_4_;
          auVar126._8_4_ = fVar120 + auVar37._8_4_;
          auVar126._12_4_ = fVar121 + auVar37._12_4_;
          auVar129._16_4_ = fVar122 + fVar43;
          auVar129._0_16_ = auVar126;
          auVar129._20_4_ = fVar123 + fVar44;
          auVar129._24_4_ = fVar124 + fVar45;
          auVar129._28_4_ = auVar42._28_4_ + auVar93._28_4_ + fVar46;
          _local_25a0 = auVar72._16_16_;
          auVar36 = vpminsd_avx(auVar16._16_16_,_local_25a0);
          auVar35 = vpminsd_avx(auVar54,auVar71);
          register0x00001310 = auVar36;
          _local_2580 = auVar35;
          local_2550 = auVar107._16_16_;
          auVar36 = vpminsd_avx(auVar17._16_16_,local_2550);
          auVar35 = vpminsd_avx(auVar47,auVar105);
          auVar117._16_16_ = auVar36;
          auVar117._0_16_ = auVar35;
          auVar36 = vpminsd_avx(auVar18._16_16_,auVar129._16_16_);
          auVar35 = vpminsd_avx(auVar37,auVar126);
          auVar93._16_16_ = auVar36;
          auVar93._0_16_ = auVar35;
          auVar93 = vmaxps_avx(auVar117,auVar93);
          auVar36 = vpmaxsd_avx(auVar16._16_16_,_local_25a0);
          auVar35 = vpmaxsd_avx(auVar54,auVar71);
          auVar56._16_16_ = auVar36;
          auVar56._0_16_ = auVar35;
          auVar91 = ZEXT3264(local_2480);
          auVar36 = vpmaxsd_avx(auVar17._16_16_,local_2550);
          auVar35 = vpmaxsd_avx(auVar47,auVar105);
          auVar49._16_16_ = auVar36;
          auVar49._0_16_ = auVar35;
          auVar36 = vpmaxsd_avx(auVar18._16_16_,auVar129._16_16_);
          auVar35 = vpmaxsd_avx(auVar37,auVar126);
          auVar42._16_16_ = auVar36;
          auVar42._0_16_ = auVar35;
          auVar42 = vminps_avx(auVar49,auVar42);
          auVar5 = vmaxps_avx(auVar127,_local_2580);
          auVar93 = vmaxps_avx(auVar5,auVar93);
          local_25c0._4_4_ = auVar93._4_4_ * 0.99999964;
          local_25c0._0_4_ = auVar93._0_4_ * 0.99999964;
          local_25c0._8_4_ = auVar93._8_4_ * 0.99999964;
          local_25c0._12_4_ = auVar93._12_4_ * 0.99999964;
          local_25c0._16_4_ = auVar93._16_4_ * 0.99999964;
          local_25c0._20_4_ = auVar93._20_4_ * 0.99999964;
          local_25c0._24_4_ = auVar93._24_4_ * 0.99999964;
          local_25c0._28_4_ = auVar93._28_4_;
          auVar93 = vminps_avx(auVar34._0_32_,auVar56);
          auVar93 = vminps_avx(auVar93,auVar42);
          auVar5._4_4_ = auVar93._4_4_ * 1.0000004;
          auVar5._0_4_ = auVar93._0_4_ * 1.0000004;
          auVar5._8_4_ = auVar93._8_4_ * 1.0000004;
          auVar5._12_4_ = auVar93._12_4_ * 1.0000004;
          auVar5._16_4_ = auVar93._16_4_ * 1.0000004;
          auVar5._20_4_ = auVar93._20_4_ * 1.0000004;
          auVar5._24_4_ = auVar93._24_4_ * 1.0000004;
          auVar5._28_4_ = auVar93._28_4_;
          auVar93 = vcmpps_avx(local_25c0,auVar5,2);
          auVar36 = vpackssdw_avx(auVar93._0_16_,auVar93._16_16_);
          auVar94 = ZEXT3264(local_24a0);
          auVar97 = ZEXT3264(local_24c0);
          auVar108 = ZEXT3264(local_24e0);
          auVar118 = ZEXT3264(local_2500);
          auVar73 = ZEXT3264(local_2520);
          auVar125 = ZEXT3264(local_2540);
        }
        auVar36 = vpsllw_avx(auVar36,0xf);
        if ((((((((auVar36 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                 (auVar36 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar36 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar36 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar36 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar36 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar36 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar36[0xf]
           ) goto LAB_014c62ec;
        auVar36 = vpacksswb_avx(auVar36,auVar36);
        bVar8 = SUB161(auVar36 >> 7,0) & 1 | (SUB161(auVar36 >> 0xf,0) & 1) << 1 |
                (SUB161(auVar36 >> 0x17,0) & 1) << 2 | (SUB161(auVar36 >> 0x1f,0) & 1) << 3 |
                (SUB161(auVar36 >> 0x27,0) & 1) << 4 | (SUB161(auVar36 >> 0x2f,0) & 1) << 5 |
                (SUB161(auVar36 >> 0x37,0) & 1) << 6 | SUB161(auVar36 >> 0x3f,0) << 7;
        uVar23 = uVar21 & 0xfffffffffffffff0;
        lVar22 = 0;
        if (bVar8 != 0) {
          for (; (bVar8 >> lVar22 & 1) == 0; lVar22 = lVar22 + 1) {
          }
        }
        uVar21 = *(ulong *)(uVar23 + lVar22 * 8);
        uVar29 = bVar8 - 1 & (uint)bVar8;
        if (uVar29 != 0) {
          uVar3 = *(uint *)(local_25c0 + lVar22 * 4);
          lVar22 = 0;
          if (uVar29 != 0) {
            for (; (uVar29 >> lVar22 & 1) == 0; lVar22 = lVar22 + 1) {
            }
          }
          uVar25 = *(ulong *)(uVar23 + lVar22 * 8);
          uVar4 = *(uint *)(local_25c0 + lVar22 * 4);
          uVar29 = uVar29 - 1 & uVar29;
          if (uVar29 == 0) {
            if (uVar3 < uVar4) {
              *(ulong *)*pauVar32 = uVar25;
              *(uint *)(*pauVar32 + 8) = uVar4;
              pauVar32 = pauVar32 + 1;
            }
            else {
              *(ulong *)*pauVar32 = uVar21;
              *(uint *)(*pauVar32 + 8) = uVar3;
              uVar21 = uVar25;
              pauVar32 = pauVar32 + 1;
            }
          }
          else {
            auVar38._8_8_ = 0;
            auVar38._0_8_ = uVar21;
            auVar36 = vpunpcklqdq_avx(auVar38,ZEXT416(uVar3));
            auVar48._8_8_ = 0;
            auVar48._0_8_ = uVar25;
            auVar35 = vpunpcklqdq_avx(auVar48,ZEXT416(uVar4));
            lVar22 = 0;
            if (uVar29 != 0) {
              for (; (uVar29 >> lVar22 & 1) == 0; lVar22 = lVar22 + 1) {
              }
            }
            auVar55._8_8_ = 0;
            auVar55._0_8_ = *(ulong *)(uVar23 + lVar22 * 8);
            auVar80 = vpunpcklqdq_avx(auVar55,ZEXT416(*(uint *)(local_25c0 + lVar22 * 4)));
            uVar29 = uVar29 - 1 & uVar29;
            if (uVar29 == 0) {
              auVar37 = vpcmpgtd_avx(auVar35,auVar36);
              auVar63 = vpshufd_avx(auVar37,0xaa);
              auVar37 = vblendvps_avx(auVar35,auVar36,auVar63);
              auVar36 = vblendvps_avx(auVar36,auVar35,auVar63);
              auVar35 = vpcmpgtd_avx(auVar80,auVar37);
              auVar63 = vpshufd_avx(auVar35,0xaa);
              auVar35 = vblendvps_avx(auVar80,auVar37,auVar63);
              auVar80 = vblendvps_avx(auVar37,auVar80,auVar63);
              auVar37 = vpcmpgtd_avx(auVar80,auVar36);
              auVar63 = vpshufd_avx(auVar37,0xaa);
              auVar37 = vblendvps_avx(auVar80,auVar36,auVar63);
              auVar36 = vblendvps_avx(auVar36,auVar80,auVar63);
              *pauVar32 = auVar36;
              pauVar32[1] = auVar37;
              uVar21 = auVar35._0_8_;
              pauVar32 = pauVar32 + 2;
            }
            else {
              lVar22 = 0;
              if (uVar29 != 0) {
                for (; (uVar29 >> lVar22 & 1) == 0; lVar22 = lVar22 + 1) {
                }
              }
              auVar65._8_8_ = 0;
              auVar65._0_8_ = *(ulong *)(uVar23 + lVar22 * 8);
              auVar37 = vpunpcklqdq_avx(auVar65,ZEXT416(*(uint *)(local_25c0 + lVar22 * 4)));
              uVar29 = uVar29 - 1 & uVar29;
              uVar25 = (ulong)uVar29;
              if (uVar29 == 0) {
                auVar63 = vpcmpgtd_avx(auVar35,auVar36);
                auVar66 = vpshufd_avx(auVar63,0xaa);
                auVar63 = vblendvps_avx(auVar35,auVar36,auVar66);
                auVar36 = vblendvps_avx(auVar36,auVar35,auVar66);
                auVar35 = vpcmpgtd_avx(auVar37,auVar80);
                auVar66 = vpshufd_avx(auVar35,0xaa);
                auVar35 = vblendvps_avx(auVar37,auVar80,auVar66);
                auVar80 = vblendvps_avx(auVar80,auVar37,auVar66);
                auVar37 = vpcmpgtd_avx(auVar80,auVar36);
                auVar66 = vpshufd_avx(auVar37,0xaa);
                auVar37 = vblendvps_avx(auVar80,auVar36,auVar66);
                auVar36 = vblendvps_avx(auVar36,auVar80,auVar66);
                auVar80 = vpcmpgtd_avx(auVar35,auVar63);
                auVar66 = vpshufd_avx(auVar80,0xaa);
                auVar80 = vblendvps_avx(auVar35,auVar63,auVar66);
                auVar35 = vblendvps_avx(auVar63,auVar35,auVar66);
                auVar63 = vpcmpgtd_avx(auVar37,auVar35);
                auVar66 = vpshufd_avx(auVar63,0xaa);
                auVar63 = vblendvps_avx(auVar37,auVar35,auVar66);
                auVar35 = vblendvps_avx(auVar35,auVar37,auVar66);
                *pauVar32 = auVar36;
                pauVar32[1] = auVar35;
                pauVar32[2] = auVar63;
                uVar21 = auVar80._0_8_;
                pauVar24 = pauVar32 + 3;
              }
              else {
                *pauVar32 = auVar36;
                pauVar32[1] = auVar35;
                pauVar32[2] = auVar80;
                pauVar32[3] = auVar37;
                lVar22 = 0x30;
                do {
                  lVar27 = lVar22;
                  lVar22 = 0;
                  if (uVar25 != 0) {
                    for (; (uVar25 >> lVar22 & 1) == 0; lVar22 = lVar22 + 1) {
                    }
                  }
                  uVar21 = *(ulong *)(uVar23 + lVar22 * 8);
                  auVar39._8_8_ = 0;
                  auVar39._0_8_ = uVar21;
                  auVar36 = vpunpcklqdq_avx(auVar39,ZEXT416(*(uint *)(local_25c0 + lVar22 * 4)));
                  *(undefined1 (*) [16])(pauVar32[1] + lVar27) = auVar36;
                  uVar25 = uVar25 & uVar25 - 1;
                  lVar22 = lVar27 + 0x10;
                } while (uVar25 != 0);
                pauVar24 = (undefined1 (*) [16])(pauVar32[1] + lVar27);
                if (lVar27 + 0x10 != 0) {
                  lVar22 = 0x10;
                  pauVar26 = pauVar32;
                  do {
                    auVar36 = pauVar26[1];
                    pauVar26 = pauVar26 + 1;
                    uVar29 = vextractps_avx(auVar36,2);
                    lVar27 = lVar22;
                    do {
                      if (uVar29 <= *(uint *)(pauVar32[-1] + lVar27 + 8)) {
                        pauVar28 = (undefined1 (*) [16])(*pauVar32 + lVar27);
                        break;
                      }
                      *(undefined1 (*) [16])(*pauVar32 + lVar27) =
                           *(undefined1 (*) [16])(pauVar32[-1] + lVar27);
                      lVar27 = lVar27 + -0x10;
                      pauVar28 = pauVar32;
                    } while (lVar27 != 0);
                    *pauVar28 = auVar36;
                    lVar22 = lVar22 + 0x10;
                  } while (pauVar24 != pauVar26);
                  uVar21 = *(ulong *)*pauVar24;
                }
              }
              auVar73 = ZEXT3264(auVar73._0_32_);
              auVar125 = ZEXT3264(auVar125._0_32_);
              pauVar32 = pauVar24;
            }
          }
        }
        goto LAB_014c5b69;
      }
LAB_014c62ec:
    } while (pauVar32 != (undefined1 (*) [16])&local_23a0);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }